

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.h
# Opt level: O3

__pid_t __thiscall MppMutexCond::wait(MppMutexCond *this,void *__stat_loc)

{
  int iVar1;
  timespec local_30;
  
  clock_gettime(5,&local_30);
  local_30.tv_nsec = ((long)__stat_loc % 1000) * 1000000 + local_30.tv_nsec;
  local_30.tv_sec = (long)__stat_loc / 1000 + local_30.tv_sec + local_30.tv_nsec / 1000000000;
  local_30.tv_nsec = local_30.tv_nsec % 1000000000;
  iVar1 = pthread_cond_timedwait
                    ((pthread_cond_t *)&this->mCondition,(pthread_mutex_t *)this,&local_30);
  return iVar1;
}

Assistant:

RK_S32  wait(RK_S64 timeout) { return mCondition.timedwait(mLock, timeout); }